

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall VBW::ConvexCell::compute_mg(ConvexCell *this,double *m,vec3 *result)

{
  pointer pvVar1;
  pointer pTVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  ushort uVar14;
  ushort uVar15;
  uint uVar16;
  pointer pvVar17;
  pointer pTVar18;
  pointer pTVar19;
  pointer puVar20;
  ulong uVar21;
  ushort *puVar22;
  ulong uVar23;
  ushort *puVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  ushort local_94;
  ushort local_92;
  ConvexCell *local_90;
  pointer local_88;
  ulong local_80;
  double local_78;
  string local_70;
  string local_50;
  
  result->x = 0.0;
  result->y = 0.0;
  result->z = 0.0;
  *m = 0.0;
  uVar23 = (ulong)this->nb_v_;
  if (uVar23 != 0) {
    puVar20 = (this->v2t_).
              super_vector<unsigned_short,_GEO::Memory::aligned_allocator<unsigned_short,_64>_>.
              super__Vector_base<unsigned_short,_GEO::Memory::aligned_allocator<unsigned_short,_64>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar25 = 0x3fff;
    uVar26 = 0;
    local_90 = this;
    local_88 = puVar20;
    local_80 = uVar23;
    do {
      uVar14 = puVar20[uVar26];
      if (uVar14 != 0x3fff) {
        if ((int)uVar25 == 0x3fff) {
          uVar25 = (ulong)uVar14;
        }
        else {
          pvVar17 = (local_90->triangle_point_).
                    super_vector<GEO::vecng<3U,_double>,_GEO::Memory::aligned_allocator<GEO::vecng<3U,_double>,_64>_>
                    .
                    super__Vector_base<GEO::vecng<3U,_double>,_GEO::Memory::aligned_allocator<GEO::vecng<3U,_double>,_64>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar1 = pvVar17 + uVar25;
          pTVar18 = (local_90->t_).
                    super_vector<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
                    .
                    super__Vector_base<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar19 = (local_90->t_adj_).
                    super_vector<VBW::Triangle,_GEO::Memory::aligned_allocator<VBW::Triangle,_64>_>.
                    super__Vector_base<VBW::Triangle,_GEO::Memory::aligned_allocator<VBW::Triangle,_64>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar22 = &local_94;
          uVar27 = 0;
          uVar21 = (ulong)(uint)uVar14;
          do {
            puVar24 = puVar22;
            if (1 < uVar27) {
              dVar3 = pvVar1->x;
              dVar4 = pvVar1->y;
              dVar5 = pvVar1->z;
              uVar23 = (ulong)local_94;
              dVar6 = pvVar17[uVar23].x;
              dVar7 = pvVar17[uVar23].y;
              local_78 = pvVar17[uVar23].z;
              uVar23 = (ulong)local_92;
              dVar8 = pvVar17[uVar23].x;
              dVar9 = pvVar17[uVar23].y;
              dVar10 = pvVar17[uVar23].z;
              dVar11 = pvVar17[uVar21].x;
              dVar29 = dVar7 - dVar4;
              dVar32 = dVar8 - dVar3;
              dVar30 = dVar9 - dVar4;
              dVar28 = dVar10 - dVar5;
              dVar31 = dVar6 - dVar3;
              dVar12 = pvVar17[uVar21].y;
              dVar13 = pvVar17[uVar21].z;
              dVar28 = ABS((dVar30 * dVar31 - dVar32 * dVar29) * (dVar13 - dVar5) +
                           ((local_78 - dVar5) * dVar32 - dVar28 * dVar31) * (dVar12 - dVar4) +
                           (dVar29 * dVar28 - dVar30 * (local_78 - dVar5)) * (dVar11 - dVar3)) / 6.0
              ;
              *m = *m + dVar28;
              result->x = (dVar3 + dVar6 + dVar8 + dVar11) * dVar28 * 0.25 + result->x;
              result->y = (dVar4 + dVar7 + dVar9 + dVar12) * dVar28 * 0.25 + result->y;
              result->z = (dVar5 + local_78 + dVar10 + dVar13) * dVar28 * 0.25 + result->z;
              puVar24 = &local_92;
            }
            *puVar24 = (ushort)uVar21;
            uVar27 = uVar27 + 1;
            if (uVar27 == 100000) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"count < 100000","");
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                         ,"");
              GEO::geo_assertion_failed(&local_50,&local_70,0x6f32);
            }
            puVar22 = puVar22 + 1;
            pTVar2 = pTVar18 + uVar21;
            uVar16._0_2_ = (pTVar2->super_Triangle).i;
            uVar16._2_2_ = (pTVar2->super_Triangle).j;
            uVar15 = (&pTVar19[uVar21].i)
                     [((uint)(uVar16 >> 0x10 == uVar26) +
                       (uint)(uVar26 == pTVar18[uVar21].super_Triangle.k) * 2 + 1) % 3];
            uVar21 = (ulong)uVar15;
            puVar20 = local_88;
            uVar23 = local_80;
          } while (uVar15 != uVar14);
        }
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar23);
  }
  return;
}

Assistant:

void ConvexCell::compute_mg(double& m, vec3& result) const {
	vbw_assert(!geometry_dirty_);
	result = make_vec3(0.0, 0.0, 0.0);
	m = 0.0;

	ushort t_origin = END_OF_LIST;
	for(index_t v=0; v<nb_v_; ++v) {
	    if(v2t_[v] == END_OF_LIST) {
		continue;
	    }
	    if(t_origin == END_OF_LIST) {
		t_origin = v2t_[v];
		continue;
	    }
	    ushort t1t2[2];
	    index_t cur=0;
	    index_t t = v2t_[v];
	    index_t count = 0;
	    do {
		if(cur < 2) {
		    t1t2[cur] = ushort(t);
		} else {
		    vec3 p = triangle_point_[t_origin];
		    vec3 q = triangle_point_[t1t2[0]];
		    vec3 r = triangle_point_[t1t2[1]];
		    vec3 s = triangle_point_[t];
		    double cur_m = tet_volume(p,q,r,s);
		    m += cur_m;
		    result.x += cur_m*(p.x + q.x + r.x + s.x)/4.0;
		    result.y += cur_m*(p.y + q.y + r.y + s.y)/4.0;
		    result.z += cur_m*(p.z + q.z + r.z + s.z)/4.0;
		    t1t2[1] = ushort(t);
		}
		++cur;
		index_t lv = triangle_find_vertex(t,v);		   
		t = triangle_adjacent(t, (lv + 1)%3);
		++count;
		geo_assert(count < 100000);
	    } while(t != v2t_[v]);
	}
    }